

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  _Bool _Var4;
  uint16_t uVar5;
  container_t *c2_00;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  int length2;
  int length1;
  roaring_array_t *ra2;
  roaring_array_t *ra1;
  int32_t in_stack_ffffffffffffffa8;
  ushort in_stack_ffffffffffffffae;
  roaring_array_t *in_stack_ffffffffffffffb0;
  uint8_t local_3e;
  uint8_t local_3d;
  uint16_t local_3c;
  uint8_t type1_00;
  int iVar6;
  int iVar7;
  
  iVar1 = in_RDI->size;
  iVar2 = in_RSI->size;
  iVar7 = 0;
  iVar6 = 0;
  while( true ) {
    uVar3 = in_stack_ffffffffffffffae & 0xff;
    if (iVar7 < iVar1) {
      uVar3 = CONCAT11(iVar6 < iVar2,(char)in_stack_ffffffffffffffae);
    }
    in_stack_ffffffffffffffae = uVar3;
    if ((char)(in_stack_ffffffffffffffae >> 8) == '\0') break;
    uVar5 = ra_get_key_at_index(in_RDI,(uint16_t)iVar7);
    local_3c = ra_get_key_at_index(in_RSI,(uint16_t)iVar6);
    if (uVar5 == local_3c) {
      c2_00 = ra_get_container_at_index(in_RDI,(uint16_t)iVar7,&local_3d);
      type1_00 = (uint8_t)(uVar5 >> 8);
      in_stack_ffffffffffffffb0 =
           (roaring_array_t *)ra_get_container_at_index(in_RSI,(uint16_t)iVar6,&local_3e);
      _Var4 = container_is_subset((container_t *)CONCAT44(iVar7,iVar6),type1_00,c2_00,
                                  (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38));
      if (!_Var4) {
        return false;
      }
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + 1;
    }
    else {
      if (uVar5 < local_3c) {
        return false;
      }
      iVar6 = ra_advance_until(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae,
                               in_stack_ffffffffffffffa8);
    }
  }
  if (iVar7 == iVar1) {
    return true;
  }
  return false;
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size, length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, (uint16_t)pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 =
                ra_get_container_at_index(ra1, (uint16_t)pos1, &type1);
            container_t *c2 =
                ra_get_container_at_index(ra2, (uint16_t)pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2)) return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}